

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O0

zt_ipv4_node * zt_ipv4_tbl_search_node(zt_ipv4_tbl *tbl,zt_ipv4_node *node)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long in_RSI;
  long in_RDI;
  uint32_t key;
  uint32_t addr_masked;
  zt_ipv4_node *match;
  int i;
  int bit_iter;
  zt_ipv4_node *local_28;
  int local_20;
  zt_ipv4_node *local_8;
  
  local_20 = 0;
  if (*(long *)(in_RDI + 0x130) == 0) {
    while( true ) {
      iVar3 = local_20 + 1;
      uVar1 = (uint)*(byte *)(in_RDI + 0x108 + (long)local_20);
      if (uVar1 == 0) break;
      for (local_28 = *(zt_ipv4_node **)
                       (*(long *)(in_RDI + 8 + (long)(int)(uVar1 - 1) * 8) +
                       (ulong)(*(uint *)(*(long *)(in_RSI + 8) + 4) & netmask_tbl[(int)uVar1] &
                              *(int *)(in_RDI + 0x128) - 1U) * 8); local_20 = iVar3,
          local_28 != (zt_ipv4_node *)0x0; local_28 = local_28->next) {
        iVar2 = ipv4_tbl_addr_cmp(local_28->addr,*(zt_ipv4_addr **)(in_RSI + 8));
        if (iVar2 != 0) {
          return local_28;
        }
      }
    }
    local_8 = (zt_ipv4_node *)0x0;
  }
  else {
    local_8 = *(zt_ipv4_node **)(in_RDI + 0x130);
  }
  return local_8;
}

Assistant:

zt_ipv4_node   *
zt_ipv4_tbl_search_node(zt_ipv4_tbl * tbl, zt_ipv4_node * node)
{
    int           bit_iter;
    int           i = 0;
    zt_ipv4_node *match = NULL;

    if (tbl->any) {
        return tbl->any;
    }

    while (1) {
        uint32_t addr_masked;
        uint32_t key;

        bit_iter = tbl->in[i++];

        if (!bit_iter) {
            break;
        }

        addr_masked = node->addr->addr & netmask_tbl[bit_iter];
        key = addr_masked & (tbl->sz - 1);

        match = tbl->tbl[bit_iter - 1][key];

        while (match) {
            if (ipv4_tbl_addr_cmp(match->addr, node->addr)) {
                return match;
            }

            match = match->next;
        }
    }

    return NULL;
}